

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

ostream * el::base::debug::operator<<(ostream *os,StackTrace *st)

{
  ostream *ss;
  StackTraceEntry *si;
  
  for (si = (st->m_stack).
            super__Vector_base<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
      si != (st->m_stack).
            super__Vector_base<el::base::debug::StackTrace::StackTraceEntry,_std::allocator<el::base::debug::StackTrace::StackTraceEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish; si = si + 1) {
    ss = std::operator<<((ostream *)os,"    ");
    operator<<((ostream *)ss,si);
    std::operator<<(ss,"\n");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StackTrace& st) {
  std::vector<StackTrace::StackTraceEntry>::const_iterator it = st.m_stack.begin();
  while (it != st.m_stack.end()) {
    os << "    " << *it++ << "\n";
  }
  return os;
}